

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckPurifyOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  cmCTest *this_00;
  ulong uVar1;
  size_type sVar2;
  bool bVar3;
  __type _Var4;
  char *msg;
  size_type sVar5;
  ostream *poVar6;
  reference pvVar7;
  reference pvVar8;
  string local_4e8 [32];
  string local_4c8;
  string local_4a8 [32];
  string local_488;
  undefined1 local_468 [8];
  ostringstream cmCTestLog_msg;
  string local_2f0;
  ulong local_2d0;
  size_type cc;
  size_type failure;
  string *l;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_298 [4];
  int defects;
  RegularExpression pfW;
  ostringstream ostr;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<int,_std::allocator<int>_> *results_local;
  string *log_local;
  string *str_local;
  cmCTestMemCheckHandler *this_local;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)results;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  cmsys::SystemTools::Split
            (str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pfW.progsize);
  std::__cxx11::string::clear();
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)local_298,"^\\[[WEI]\\] ([A-Z][A-Z][A-Z][A-Z]*): ");
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
  l = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&l);
    if (!bVar3) {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)log,local_4e8);
      std::__cxx11::string::~string(local_4e8);
      this->DefectCount = __range1._4_4_ + this->DefectCount;
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_298);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pfW.progsize);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      return __range1._4_4_ == 0;
    }
    failure = (size_type)
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    cc = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size(&this->ResultStrings);
    bVar3 = cmsys::RegularExpression::find((RegularExpression *)local_298,(string *)failure);
    if (bVar3) {
      for (local_2d0 = 0; uVar1 = local_2d0,
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->ResultStrings), uVar1 < sVar5; local_2d0 = local_2d0 + 1) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_2f0,(RegularExpression *)local_298,1);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->ResultStrings,local_2d0);
        _Var4 = std::operator==(&local_2f0,pvVar7);
        std::__cxx11::string::~string((string *)&local_2f0);
        if (_Var4) {
          cc = local_2d0;
          break;
        }
      }
      uVar1 = local_2d0;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->ResultStrings);
      if (uVar1 == sVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
        poVar6 = std::operator<<((ostream *)local_468,"Unknown Purify memory fault: ");
        cmsys::RegularExpression::match_abi_cxx11_(&local_488,(RegularExpression *)local_298,1);
        poVar6 = std::operator<<(poVar6,(string *)&local_488);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_488);
        this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::ostringstream::str();
        msg = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(this_00,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x38a,msg,false);
        std::__cxx11::string::~string(local_4a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
        poVar6 = std::operator<<((ostream *)&pfW.progsize,"*** Unknown Purify memory fault: ");
        cmsys::RegularExpression::match_abi_cxx11_(&local_4c8,(RegularExpression *)local_298,1);
        poVar6 = std::operator<<(poVar6,(string *)&local_4c8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_4c8);
      }
    }
    sVar2 = cc;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->ResultStrings);
    if (sVar2 != sVar5) {
      poVar6 = std::operator<<((ostream *)&pfW.progsize,"<b>");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->ResultStrings,cc);
      poVar6 = std::operator<<(poVar6,(string *)pvVar7);
      std::operator<<(poVar6,"</b> ");
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,cc);
      *pvVar8 = *pvVar8 + 1;
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    poVar6 = std::operator<<((ostream *)&pfW.progsize,(string *)failure);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckPurifyOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  std::ostringstream ostr;
  log.clear();

  cmsys::RegularExpression pfW("^\\[[WEI]\\] ([A-Z][A-Z][A-Z][A-Z]*): ");

  int defects = 0;

  for (std::string const& l : lines) {
    std::vector<int>::size_type failure = this->ResultStrings.size();
    if (pfW.find(l)) {
      std::vector<int>::size_type cc;
      for (cc = 0; cc < this->ResultStrings.size(); cc++) {
        if (pfW.match(1) == this->ResultStrings[cc]) {
          failure = cc;
          break;
        }
      }
      if (cc == this->ResultStrings.size()) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Unknown Purify memory fault: " << pfW.match(1)
                                                   << std::endl);
        ostr << "*** Unknown Purify memory fault: " << pfW.match(1)
             << std::endl;
      }
    }
    if (failure != this->ResultStrings.size()) {
      ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
      results[failure]++;
      defects++;
    }
    ostr << l << std::endl;
  }

  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}